

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenCallSetTarget(BinaryenExpressionRef expr,char *target)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *target_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)target;
  target_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::Call>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Call>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x8b7,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
  }
  if (expression != (Expression *)0x0) {
    wasm::Name::Name(&local_30,(char *)expression);
    wasm::Name::operator=((Name *)(local_20 + 3),&local_30);
    return;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x8b8,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallSetTarget(BinaryenExpressionRef expr, const char* target) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Call>());
  assert(target);
  static_cast<Call*>(expression)->target = target;
}